

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O0

void __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
::MeshPredictionSchemeTexCoordsDecoder
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
           *this,PointAttribute *attribute,
          PredictionSchemeWrapDecodingTransform<int,_int> *transform,
          MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *mesh_data,int version)

{
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  *in_RCX;
  PredictionSchemeWrapDecodingTransform<int,_int> *in_RDI;
  undefined4 in_R8D;
  MeshPredictionSchemeData<draco::MeshAttributeCornerTable> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd8;
  
  MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::MeshAttributeCornerTable>_>
  ::MeshPredictionSchemeDecoder
            (in_RCX,(PointAttribute *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_RDI,
             in_stack_ffffffffffffffc8);
  *(undefined ***)&in_RDI->super_PredictionSchemeWrapTransformBase<int> =
       &PTR__MeshPredictionSchemeTexCoordsDecoder_002739c0;
  in_RDI[2].super_PredictionSchemeWrapTransformBase<int>.num_components_ = 0;
  in_RDI[2].super_PredictionSchemeWrapTransformBase<int>.min_value_ = 0;
  in_RDI[2].super_PredictionSchemeWrapTransformBase<int>.max_value_ = 0;
  in_RDI[2].super_PredictionSchemeWrapTransformBase<int>.max_dif_ = 0;
  std::unique_ptr<int[],std::default_delete<int[]>>::unique_ptr<std::default_delete<int[]>,void>
            ((unique_ptr<int[],_std::default_delete<int[]>_> *)in_RDI);
  *(undefined4 *)
   &in_RDI[2].super_PredictionSchemeWrapTransformBase<int>.clamped_value_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 0;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1e284f);
  *(undefined4 *)
   &in_RDI[3].super_PredictionSchemeWrapTransformBase<int>.clamped_value_.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = in_R8D;
  return;
}

Assistant:

MeshPredictionSchemeTexCoordsDecoder(const PointAttribute *attribute,
                                       const TransformT &transform,
                                       const MeshDataT &mesh_data, int version)
      : MeshPredictionSchemeDecoder<DataTypeT, TransformT, MeshDataT>(
            attribute, transform, mesh_data),
        pos_attribute_(nullptr),
        entry_to_point_id_map_(nullptr),
        num_components_(0),
        version_(version) {}